

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<9,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  float afStack_c0 [6];
  float local_a8 [4];
  float local_98 [2];
  ulong local_90;
  undefined4 local_88;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  float local_54;
  undefined8 local_50;
  float local_48 [5];
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  float afStack_20 [2];
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = local_48;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar7;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_48._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_48[2] = (float)*(undefined8 *)(evalCtx->in[0].m_data + 2);
    uVar1 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    fStack_34 = (float)((ulong)*(undefined8 *)evalCtx->in[1].m_data >> 0x20);
    fStack_30 = (float)uVar1;
    fStack_2c = (float)((ulong)uVar1 >> 0x20);
    local_28._0_4_ = (float)*(undefined8 *)evalCtx->in[2].m_data;
    afStack_20 = *(float (*) [2])(evalCtx->in[2].m_data + 2);
    local_18 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_10._4_4_ = (float)((ulong)*(undefined8 *)(evalCtx->in[3].m_data + 2) >> 0x20);
  }
  else {
    pfVar2 = local_48;
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    afStack_20[0] = 0.0;
    afStack_20[1] = 0.0;
    fStack_34 = 0.0;
    fStack_30 = 0.0;
    fStack_2c = 0.0;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    puVar4 = &s_constInMat4x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  res_1.m_data[0] = local_48[0];
  res_1.m_data[1] = local_48[1];
  res_1.m_data[2] = local_48[2];
  res.m_data[0] = fStack_34;
  res.m_data[1] = fStack_30;
  res.m_data[2] = fStack_2c;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar3 = 0;
  do {
    local_a8[lVar3] = res_1.m_data[lVar3] + res.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_2.m_data[0] = afStack_20[0];
  res_2.m_data[1] = afStack_20[1];
  res_2.m_data[2] = (float)local_28;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_90 = local_90 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    local_98[lVar3] = local_a8[lVar3] + res_2.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_54 = uStack_10._4_4_;
  local_50 = local_18;
  afStack_c0[2] = 0.0;
  afStack_c0[3] = 0.0;
  afStack_c0[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_c0[lVar3 + 2] = local_98[lVar3] + (&local_54)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_90 = 0x100000000;
  local_88 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_98[lVar3]] = afStack_c0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}